

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

int nonius::list_reporters(void)

{
  int iVar1;
  _Hash_node_base *p_Var2;
  reporter_registry *prVar3;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
  _Var4;
  ostream *poVar5;
  __node_base *p_Var6;
  string local_50 [32];
  
  prVar3 = global_reporter_registry_abi_cxx11_();
  p_Var2 = (prVar3->_M_h)._M_before_begin._M_nxt;
  global_reporter_registry_abi_cxx11_();
  _Var4 = std::
          __max_element<std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,std::unique_ptr<nonius::reporter,std::default_delete<nonius::reporter>>>,false,true>,__gnu_cxx::__ops::_Iter_comp_iter<nonius::list_reporters()::_lambda(std::pair<std::__cxx11::string_const,std::unique_ptr<nonius::reporter,std::default_delete<nonius::reporter>>>&,std::pair<std::__cxx11::string_const,std::unique_ptr<nonius::reporter,std::default_delete<nonius::reporter>>>&)_1_>>
                    (p_Var2,0);
  iVar1 = *(int *)((long)_Var4.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
                         ._M_cur + 0x10);
  std::operator<<((ostream *)&std::cout,"Available reporters:\n");
  *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
  prVar3 = global_reporter_registry_abi_cxx11_();
  p_Var6 = &(prVar3->_M_h)._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    if (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var6 + 2))->_M_max_load_factor !=
        (_Hash_node_base *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"  ");
      *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = (long)(iVar1 + 2);
      poVar5 = std::operator<<(poVar5,(string *)(p_Var6 + 1));
      (*(code *)(p_Var6[5]._M_nxt)->_M_nxt[2]._M_nxt)(local_50);
      poVar5 = std::operator<<(poVar5,local_50);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string(local_50);
    }
  }
  std::operator<<((ostream *)&std::cout,'\n');
  return 0;
}

Assistant:

inline int list_reporters() {
        using reporter_entry_ref = decltype(*global_reporter_registry().begin());
        auto cmp = [](reporter_entry_ref a, reporter_entry_ref b) { return a.first.size() < b.first.size(); };
        auto width = 2 + std::max_element(global_reporter_registry().begin(), global_reporter_registry().end(), cmp)->first.size();

        std::cout << "Available reporters:\n";
        std::cout << std::left;
        for(auto&& r : global_reporter_registry()) {
            if(!r.first.empty()) {
                std::cout << "  " << std::setw(width) << r.first << r.second->description() << "\n";
            }
        }
        std::cout << '\n';
        return 0;
    }